

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O3

int pospopcnt_u16_avx2_blend_popcnt_unroll8(uint16_t *array,uint32_t len,uint32_t *flags)

{
  int *piVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  ulong uVar250;
  byte bVar251;
  byte bVar252;
  byte bVar253;
  byte bVar254;
  byte bVar255;
  byte bVar256;
  byte bVar257;
  byte bVar258;
  ulong uVar259;
  ulong uVar260;
  ulong uVar261;
  long lVar262;
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  undefined1 auVar273 [64];
  undefined1 auVar274 [64];
  undefined1 auVar275 [64];
  undefined1 auVar276 [64];
  
  auVar268 = _DAT_001126c0;
  auVar267 = _DAT_001126a0;
  uVar250 = (ulong)(len >> 4);
  if (len < 0x80) {
    uVar261 = 0;
  }
  else {
    uVar260 = 0;
    uVar259 = 8;
    do {
      uVar261 = uVar259;
      lVar262 = 0x20;
      auVar271 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar260 * 0x10),auVar267,
                                   *(undefined1 (*) [32])(array + uVar260 * 0x10 + 0x10));
      auVar272 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar260 * 0x10 + 0x10),auVar268,
                                   *(undefined1 (*) [32])(array + uVar260 * 0x10));
      auVar269 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar260 * 0x10 + 0x20),auVar267,
                                   *(undefined1 (*) [32])(array + uVar260 * 0x10 + 0x30));
      auVar270 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar260 * 0x10 + 0x30),auVar268,
                                   *(undefined1 (*) [32])(array + uVar260 * 0x10 + 0x20));
      auVar263 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar260 * 0x10 + 0x40),auVar267,
                                   *(undefined1 (*) [32])(array + uVar260 * 0x10 + 0x50));
      auVar264 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar260 * 0x10 + 0x50),auVar268,
                                   *(undefined1 (*) [32])(array + uVar260 * 0x10 + 0x40));
      auVar265 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar260 * 0x10 + 0x60),auVar267,
                                   *(undefined1 (*) [32])(array + uVar260 * 0x10 + 0x70));
      auVar266 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar260 * 0x10 + 0x70),auVar268,
                                   *(undefined1 (*) [32])(array + uVar260 * 0x10 + 0x60));
      do {
        auVar2 = auVar269 >> 7;
        auVar10 = auVar269 >> 0xf;
        auVar18 = auVar269 >> 0x17;
        auVar26 = auVar269 >> 0x1f;
        auVar34 = auVar269 >> 0x27;
        auVar42 = auVar269 >> 0x2f;
        auVar50 = auVar269 >> 0x37;
        auVar66 = auVar269 >> 0x3f;
        auVar90 = auVar269 >> 0x47;
        auVar114 = auVar269 >> 0x4f;
        auVar138 = auVar269 >> 0x57;
        auVar162 = auVar269 >> 0x5f;
        auVar186 = auVar269 >> 0x67;
        auVar210 = auVar269 >> 0x6f;
        auVar234 = auVar269 >> 0x77;
        auVar58 = auVar269 >> 0x7f;
        auVar70 = auVar269 >> 0x87;
        auVar82 = auVar269 >> 0x8f;
        auVar94 = auVar269 >> 0x97;
        auVar106 = auVar269 >> 0x9f;
        auVar118 = auVar269 >> 0xa7;
        auVar130 = auVar269 >> 0xaf;
        auVar142 = auVar269 >> 0xb7;
        auVar154 = auVar269 >> 0xbf;
        auVar166 = auVar269 >> 199;
        auVar178 = auVar269 >> 0xcf;
        auVar190 = auVar269 >> 0xd7;
        auVar202 = auVar269 >> 0xdf;
        auVar214 = auVar269 >> 0xe7;
        auVar226 = auVar269 >> 0xef;
        auVar238 = auVar269 >> 0xf7;
        bVar251 = auVar269[0x1f];
        auVar3 = auVar263 >> 7;
        auVar11 = auVar263 >> 0xf;
        auVar19 = auVar263 >> 0x17;
        auVar27 = auVar263 >> 0x1f;
        auVar35 = auVar263 >> 0x27;
        auVar43 = auVar263 >> 0x2f;
        auVar51 = auVar263 >> 0x37;
        auVar67 = auVar263 >> 0x3f;
        auVar91 = auVar263 >> 0x47;
        auVar115 = auVar263 >> 0x4f;
        auVar139 = auVar263 >> 0x57;
        auVar163 = auVar263 >> 0x5f;
        auVar187 = auVar263 >> 0x67;
        auVar211 = auVar263 >> 0x6f;
        auVar235 = auVar263 >> 0x77;
        auVar59 = auVar263 >> 0x7f;
        auVar71 = auVar263 >> 0x87;
        auVar83 = auVar263 >> 0x8f;
        auVar95 = auVar263 >> 0x97;
        auVar107 = auVar263 >> 0x9f;
        auVar119 = auVar263 >> 0xa7;
        auVar131 = auVar263 >> 0xaf;
        auVar143 = auVar263 >> 0xb7;
        auVar155 = auVar263 >> 0xbf;
        auVar167 = auVar263 >> 199;
        auVar179 = auVar263 >> 0xcf;
        auVar191 = auVar263 >> 0xd7;
        auVar203 = auVar263 >> 0xdf;
        auVar215 = auVar263 >> 0xe7;
        auVar227 = auVar263 >> 0xef;
        auVar239 = auVar263 >> 0xf7;
        bVar252 = auVar263[0x1f];
        auVar4 = auVar271 >> 7;
        auVar12 = auVar271 >> 0xf;
        auVar20 = auVar271 >> 0x17;
        auVar28 = auVar271 >> 0x1f;
        auVar36 = auVar271 >> 0x27;
        auVar44 = auVar271 >> 0x2f;
        auVar52 = auVar271 >> 0x37;
        auVar68 = auVar271 >> 0x3f;
        auVar92 = auVar271 >> 0x47;
        auVar116 = auVar271 >> 0x4f;
        auVar140 = auVar271 >> 0x57;
        auVar164 = auVar271 >> 0x5f;
        auVar188 = auVar271 >> 0x67;
        auVar212 = auVar271 >> 0x6f;
        auVar236 = auVar271 >> 0x77;
        auVar60 = auVar271 >> 0x7f;
        auVar72 = auVar271 >> 0x87;
        auVar84 = auVar271 >> 0x8f;
        auVar96 = auVar271 >> 0x97;
        auVar108 = auVar271 >> 0x9f;
        auVar120 = auVar271 >> 0xa7;
        auVar132 = auVar271 >> 0xaf;
        auVar144 = auVar271 >> 0xb7;
        auVar156 = auVar271 >> 0xbf;
        auVar168 = auVar271 >> 199;
        auVar180 = auVar271 >> 0xcf;
        auVar192 = auVar271 >> 0xd7;
        auVar204 = auVar271 >> 0xdf;
        auVar216 = auVar271 >> 0xe7;
        auVar228 = auVar271 >> 0xef;
        auVar240 = auVar271 >> 0xf7;
        bVar253 = auVar271[0x1f];
        auVar5 = auVar270 >> 7;
        auVar13 = auVar270 >> 0xf;
        auVar21 = auVar270 >> 0x17;
        auVar29 = auVar270 >> 0x1f;
        auVar37 = auVar270 >> 0x27;
        auVar45 = auVar270 >> 0x2f;
        auVar53 = auVar270 >> 0x37;
        auVar69 = auVar270 >> 0x3f;
        auVar93 = auVar270 >> 0x47;
        auVar117 = auVar270 >> 0x4f;
        auVar141 = auVar270 >> 0x57;
        auVar165 = auVar270 >> 0x5f;
        auVar189 = auVar270 >> 0x67;
        auVar213 = auVar270 >> 0x6f;
        auVar237 = auVar270 >> 0x77;
        auVar61 = auVar270 >> 0x7f;
        auVar73 = auVar270 >> 0x87;
        auVar85 = auVar270 >> 0x8f;
        auVar97 = auVar270 >> 0x97;
        auVar109 = auVar270 >> 0x9f;
        auVar121 = auVar270 >> 0xa7;
        auVar133 = auVar270 >> 0xaf;
        auVar145 = auVar270 >> 0xb7;
        auVar157 = auVar270 >> 0xbf;
        auVar169 = auVar270 >> 199;
        auVar181 = auVar270 >> 0xcf;
        auVar193 = auVar270 >> 0xd7;
        auVar205 = auVar270 >> 0xdf;
        auVar217 = auVar270 >> 0xe7;
        auVar229 = auVar270 >> 0xef;
        auVar241 = auVar270 >> 0xf7;
        bVar254 = auVar270[0x1f];
        auVar6 = auVar272 >> 7;
        auVar14 = auVar272 >> 0xf;
        auVar22 = auVar272 >> 0x17;
        auVar30 = auVar272 >> 0x1f;
        auVar38 = auVar272 >> 0x27;
        auVar46 = auVar272 >> 0x2f;
        auVar54 = auVar272 >> 0x37;
        auVar78 = auVar272 >> 0x3f;
        auVar102 = auVar272 >> 0x47;
        auVar126 = auVar272 >> 0x4f;
        auVar150 = auVar272 >> 0x57;
        auVar174 = auVar272 >> 0x5f;
        auVar198 = auVar272 >> 0x67;
        auVar222 = auVar272 >> 0x6f;
        auVar246 = auVar272 >> 0x77;
        auVar62 = auVar272 >> 0x7f;
        auVar74 = auVar272 >> 0x87;
        auVar86 = auVar272 >> 0x8f;
        auVar98 = auVar272 >> 0x97;
        auVar110 = auVar272 >> 0x9f;
        auVar122 = auVar272 >> 0xa7;
        auVar134 = auVar272 >> 0xaf;
        auVar146 = auVar272 >> 0xb7;
        auVar158 = auVar272 >> 0xbf;
        auVar170 = auVar272 >> 199;
        auVar182 = auVar272 >> 0xcf;
        auVar194 = auVar272 >> 0xd7;
        auVar206 = auVar272 >> 0xdf;
        auVar218 = auVar272 >> 0xe7;
        auVar230 = auVar272 >> 0xef;
        auVar242 = auVar272 >> 0xf7;
        bVar255 = auVar272[0x1f];
        auVar271 = vpaddb_avx2(auVar271,auVar271);
        auVar272 = vpaddb_avx2(auVar272,auVar272);
        auVar269 = vpaddb_avx2(auVar269,auVar269);
        auVar270 = vpaddb_avx2(auVar270,auVar270);
        auVar263 = vpaddb_avx2(auVar263,auVar263);
        auVar7 = auVar264 >> 7;
        auVar15 = auVar264 >> 0xf;
        auVar23 = auVar264 >> 0x17;
        auVar31 = auVar264 >> 0x1f;
        auVar39 = auVar264 >> 0x27;
        auVar47 = auVar264 >> 0x2f;
        auVar55 = auVar264 >> 0x37;
        auVar79 = auVar264 >> 0x3f;
        auVar103 = auVar264 >> 0x47;
        auVar127 = auVar264 >> 0x4f;
        auVar151 = auVar264 >> 0x57;
        auVar175 = auVar264 >> 0x5f;
        auVar199 = auVar264 >> 0x67;
        auVar223 = auVar264 >> 0x6f;
        auVar247 = auVar264 >> 0x77;
        auVar63 = auVar264 >> 0x7f;
        auVar75 = auVar264 >> 0x87;
        auVar87 = auVar264 >> 0x8f;
        auVar99 = auVar264 >> 0x97;
        auVar111 = auVar264 >> 0x9f;
        auVar123 = auVar264 >> 0xa7;
        auVar135 = auVar264 >> 0xaf;
        auVar147 = auVar264 >> 0xb7;
        auVar159 = auVar264 >> 0xbf;
        auVar171 = auVar264 >> 199;
        auVar183 = auVar264 >> 0xcf;
        auVar195 = auVar264 >> 0xd7;
        auVar207 = auVar264 >> 0xdf;
        auVar219 = auVar264 >> 0xe7;
        auVar231 = auVar264 >> 0xef;
        auVar243 = auVar264 >> 0xf7;
        bVar256 = auVar264[0x1f];
        auVar264 = vpaddb_avx2(auVar264,auVar264);
        auVar8 = auVar265 >> 7;
        auVar16 = auVar265 >> 0xf;
        auVar24 = auVar265 >> 0x17;
        auVar32 = auVar265 >> 0x1f;
        auVar40 = auVar265 >> 0x27;
        auVar48 = auVar265 >> 0x2f;
        auVar56 = auVar265 >> 0x37;
        auVar80 = auVar265 >> 0x3f;
        auVar104 = auVar265 >> 0x47;
        auVar128 = auVar265 >> 0x4f;
        auVar152 = auVar265 >> 0x57;
        auVar176 = auVar265 >> 0x5f;
        auVar200 = auVar265 >> 0x67;
        auVar224 = auVar265 >> 0x6f;
        auVar248 = auVar265 >> 0x77;
        auVar64 = auVar265 >> 0x7f;
        auVar76 = auVar265 >> 0x87;
        auVar88 = auVar265 >> 0x8f;
        auVar100 = auVar265 >> 0x97;
        auVar112 = auVar265 >> 0x9f;
        auVar124 = auVar265 >> 0xa7;
        auVar136 = auVar265 >> 0xaf;
        auVar148 = auVar265 >> 0xb7;
        auVar160 = auVar265 >> 0xbf;
        auVar172 = auVar265 >> 199;
        auVar184 = auVar265 >> 0xcf;
        auVar196 = auVar265 >> 0xd7;
        auVar208 = auVar265 >> 0xdf;
        auVar220 = auVar265 >> 0xe7;
        auVar232 = auVar265 >> 0xef;
        auVar244 = auVar265 >> 0xf7;
        bVar257 = auVar265[0x1f];
        auVar265 = vpaddb_avx2(auVar265,auVar265);
        auVar9 = auVar266 >> 7;
        auVar17 = auVar266 >> 0xf;
        auVar25 = auVar266 >> 0x17;
        auVar33 = auVar266 >> 0x1f;
        auVar41 = auVar266 >> 0x27;
        auVar49 = auVar266 >> 0x2f;
        auVar57 = auVar266 >> 0x37;
        auVar81 = auVar266 >> 0x3f;
        auVar105 = auVar266 >> 0x47;
        auVar129 = auVar266 >> 0x4f;
        auVar153 = auVar266 >> 0x57;
        auVar177 = auVar266 >> 0x5f;
        auVar201 = auVar266 >> 0x67;
        auVar225 = auVar266 >> 0x6f;
        auVar249 = auVar266 >> 0x77;
        auVar65 = auVar266 >> 0x7f;
        auVar77 = auVar266 >> 0x87;
        auVar89 = auVar266 >> 0x8f;
        auVar101 = auVar266 >> 0x97;
        auVar113 = auVar266 >> 0x9f;
        auVar125 = auVar266 >> 0xa7;
        auVar137 = auVar266 >> 0xaf;
        auVar149 = auVar266 >> 0xb7;
        auVar161 = auVar266 >> 0xbf;
        auVar173 = auVar266 >> 199;
        auVar185 = auVar266 >> 0xcf;
        auVar197 = auVar266 >> 0xd7;
        auVar209 = auVar266 >> 0xdf;
        auVar221 = auVar266 >> 0xe7;
        auVar233 = auVar266 >> 0xef;
        auVar245 = auVar266 >> 0xf7;
        bVar258 = auVar266[0x1f];
        auVar266 = vpaddb_avx2(auVar266,auVar266);
        *(int *)((long)flags + lVar262 + -4) =
             POPCOUNT((uint)(auVar8[0] & 1) | (uint)(auVar16[0] & 1) << 1 |
                      (uint)(auVar24[0] & 1) << 2 | (uint)(auVar32[0] & 1) << 3 |
                      (uint)(auVar40[0] & 1) << 4 | (uint)(auVar48[0] & 1) << 5 |
                      (uint)(auVar56[0] & 1) << 6 | (uint)(auVar80[0] & 1) << 7 |
                      (uint)(auVar104[0] & 1) << 8 | (uint)(auVar128[0] & 1) << 9 |
                      (uint)(auVar152[0] & 1) << 10 | (uint)(auVar176[0] & 1) << 0xb |
                      (uint)(auVar200[0] & 1) << 0xc | (uint)(auVar224[0] & 1) << 0xd |
                      (uint)(auVar248[0] & 1) << 0xe | (uint)auVar64[0] << 0xf |
                      (uint)(auVar76[0] & 1) << 0x10 | (uint)(auVar88[0] & 1) << 0x11 |
                      (uint)(auVar100[0] & 1) << 0x12 | (uint)(auVar112[0] & 1) << 0x13 |
                      (uint)(auVar124[0] & 1) << 0x14 | (uint)(auVar136[0] & 1) << 0x15 |
                      (uint)(auVar148[0] & 1) << 0x16 | (uint)auVar160[0] << 0x17 |
                      (uint)(auVar172[0] & 1) << 0x18 | (uint)(auVar184[0] & 1) << 0x19 |
                      (uint)(auVar196[0] & 1) << 0x1a | (uint)(auVar208[0] & 1) << 0x1b |
                      (uint)(auVar220[0] & 1) << 0x1c | (uint)(auVar232[0] & 1) << 0x1d |
                      (uint)(auVar244[0] & 1) << 0x1e | (uint)(bVar257 >> 7) << 0x1f) +
             POPCOUNT((uint)(auVar3[0] & 1) | (uint)(auVar11[0] & 1) << 1 |
                      (uint)(auVar19[0] & 1) << 2 | (uint)(auVar27[0] & 1) << 3 |
                      (uint)(auVar35[0] & 1) << 4 | (uint)(auVar43[0] & 1) << 5 |
                      (uint)(auVar51[0] & 1) << 6 | (uint)(auVar67[0] & 1) << 7 |
                      (uint)(auVar91[0] & 1) << 8 | (uint)(auVar115[0] & 1) << 9 |
                      (uint)(auVar139[0] & 1) << 10 | (uint)(auVar163[0] & 1) << 0xb |
                      (uint)(auVar187[0] & 1) << 0xc | (uint)(auVar211[0] & 1) << 0xd |
                      (uint)(auVar235[0] & 1) << 0xe | (uint)auVar59[0] << 0xf |
                      (uint)(auVar71[0] & 1) << 0x10 | (uint)(auVar83[0] & 1) << 0x11 |
                      (uint)(auVar95[0] & 1) << 0x12 | (uint)(auVar107[0] & 1) << 0x13 |
                      (uint)(auVar119[0] & 1) << 0x14 | (uint)(auVar131[0] & 1) << 0x15 |
                      (uint)(auVar143[0] & 1) << 0x16 | (uint)auVar155[0] << 0x17 |
                      (uint)(auVar167[0] & 1) << 0x18 | (uint)(auVar179[0] & 1) << 0x19 |
                      (uint)(auVar191[0] & 1) << 0x1a | (uint)(auVar203[0] & 1) << 0x1b |
                      (uint)(auVar215[0] & 1) << 0x1c | (uint)(auVar227[0] & 1) << 0x1d |
                      (uint)(auVar239[0] & 1) << 0x1e | (uint)(bVar252 >> 7) << 0x1f) +
             POPCOUNT((uint)(auVar2[0] & 1) | (uint)(auVar10[0] & 1) << 1 |
                      (uint)(auVar18[0] & 1) << 2 | (uint)(auVar26[0] & 1) << 3 |
                      (uint)(auVar34[0] & 1) << 4 | (uint)(auVar42[0] & 1) << 5 |
                      (uint)(auVar50[0] & 1) << 6 | (uint)(auVar66[0] & 1) << 7 |
                      (uint)(auVar90[0] & 1) << 8 | (uint)(auVar114[0] & 1) << 9 |
                      (uint)(auVar138[0] & 1) << 10 | (uint)(auVar162[0] & 1) << 0xb |
                      (uint)(auVar186[0] & 1) << 0xc | (uint)(auVar210[0] & 1) << 0xd |
                      (uint)(auVar234[0] & 1) << 0xe | (uint)auVar58[0] << 0xf |
                      (uint)(auVar70[0] & 1) << 0x10 | (uint)(auVar82[0] & 1) << 0x11 |
                      (uint)(auVar94[0] & 1) << 0x12 | (uint)(auVar106[0] & 1) << 0x13 |
                      (uint)(auVar118[0] & 1) << 0x14 | (uint)(auVar130[0] & 1) << 0x15 |
                      (uint)(auVar142[0] & 1) << 0x16 | (uint)auVar154[0] << 0x17 |
                      (uint)(auVar166[0] & 1) << 0x18 | (uint)(auVar178[0] & 1) << 0x19 |
                      (uint)(auVar190[0] & 1) << 0x1a | (uint)(auVar202[0] & 1) << 0x1b |
                      (uint)(auVar214[0] & 1) << 0x1c | (uint)(auVar226[0] & 1) << 0x1d |
                      (uint)(auVar238[0] & 1) << 0x1e | (uint)(bVar251 >> 7) << 0x1f) +
             POPCOUNT((uint)(auVar4[0] & 1) | (uint)(auVar12[0] & 1) << 1 |
                      (uint)(auVar20[0] & 1) << 2 | (uint)(auVar28[0] & 1) << 3 |
                      (uint)(auVar36[0] & 1) << 4 | (uint)(auVar44[0] & 1) << 5 |
                      (uint)(auVar52[0] & 1) << 6 | (uint)(auVar68[0] & 1) << 7 |
                      (uint)(auVar92[0] & 1) << 8 | (uint)(auVar116[0] & 1) << 9 |
                      (uint)(auVar140[0] & 1) << 10 | (uint)(auVar164[0] & 1) << 0xb |
                      (uint)(auVar188[0] & 1) << 0xc | (uint)(auVar212[0] & 1) << 0xd |
                      (uint)(auVar236[0] & 1) << 0xe | (uint)auVar60[0] << 0xf |
                      (uint)(auVar72[0] & 1) << 0x10 | (uint)(auVar84[0] & 1) << 0x11 |
                      (uint)(auVar96[0] & 1) << 0x12 | (uint)(auVar108[0] & 1) << 0x13 |
                      (uint)(auVar120[0] & 1) << 0x14 | (uint)(auVar132[0] & 1) << 0x15 |
                      (uint)(auVar144[0] & 1) << 0x16 | (uint)auVar156[0] << 0x17 |
                      (uint)(auVar168[0] & 1) << 0x18 | (uint)(auVar180[0] & 1) << 0x19 |
                      (uint)(auVar192[0] & 1) << 0x1a | (uint)(auVar204[0] & 1) << 0x1b |
                      (uint)(auVar216[0] & 1) << 0x1c | (uint)(auVar228[0] & 1) << 0x1d |
                      (uint)(auVar240[0] & 1) << 0x1e | (uint)(bVar253 >> 7) << 0x1f) +
             *(int *)((long)flags + lVar262 + -4);
        *(int *)((long)flags + lVar262 + 0x1c) =
             POPCOUNT((uint)(auVar9[0] & 1) | (uint)(auVar17[0] & 1) << 1 |
                      (uint)(auVar25[0] & 1) << 2 | (uint)(auVar33[0] & 1) << 3 |
                      (uint)(auVar41[0] & 1) << 4 | (uint)(auVar49[0] & 1) << 5 |
                      (uint)(auVar57[0] & 1) << 6 | (uint)(auVar81[0] & 1) << 7 |
                      (uint)(auVar105[0] & 1) << 8 | (uint)(auVar129[0] & 1) << 9 |
                      (uint)(auVar153[0] & 1) << 10 | (uint)(auVar177[0] & 1) << 0xb |
                      (uint)(auVar201[0] & 1) << 0xc | (uint)(auVar225[0] & 1) << 0xd |
                      (uint)(auVar249[0] & 1) << 0xe | (uint)auVar65[0] << 0xf |
                      (uint)(auVar77[0] & 1) << 0x10 | (uint)(auVar89[0] & 1) << 0x11 |
                      (uint)(auVar101[0] & 1) << 0x12 | (uint)(auVar113[0] & 1) << 0x13 |
                      (uint)(auVar125[0] & 1) << 0x14 | (uint)(auVar137[0] & 1) << 0x15 |
                      (uint)(auVar149[0] & 1) << 0x16 | (uint)auVar161[0] << 0x17 |
                      (uint)(auVar173[0] & 1) << 0x18 | (uint)(auVar185[0] & 1) << 0x19 |
                      (uint)(auVar197[0] & 1) << 0x1a | (uint)(auVar209[0] & 1) << 0x1b |
                      (uint)(auVar221[0] & 1) << 0x1c | (uint)(auVar233[0] & 1) << 0x1d |
                      (uint)(auVar245[0] & 1) << 0x1e | (uint)(bVar258 >> 7) << 0x1f) +
             POPCOUNT((uint)(auVar7[0] & 1) | (uint)(auVar15[0] & 1) << 1 |
                      (uint)(auVar23[0] & 1) << 2 | (uint)(auVar31[0] & 1) << 3 |
                      (uint)(auVar39[0] & 1) << 4 | (uint)(auVar47[0] & 1) << 5 |
                      (uint)(auVar55[0] & 1) << 6 | (uint)(auVar79[0] & 1) << 7 |
                      (uint)(auVar103[0] & 1) << 8 | (uint)(auVar127[0] & 1) << 9 |
                      (uint)(auVar151[0] & 1) << 10 | (uint)(auVar175[0] & 1) << 0xb |
                      (uint)(auVar199[0] & 1) << 0xc | (uint)(auVar223[0] & 1) << 0xd |
                      (uint)(auVar247[0] & 1) << 0xe | (uint)auVar63[0] << 0xf |
                      (uint)(auVar75[0] & 1) << 0x10 | (uint)(auVar87[0] & 1) << 0x11 |
                      (uint)(auVar99[0] & 1) << 0x12 | (uint)(auVar111[0] & 1) << 0x13 |
                      (uint)(auVar123[0] & 1) << 0x14 | (uint)(auVar135[0] & 1) << 0x15 |
                      (uint)(auVar147[0] & 1) << 0x16 | (uint)auVar159[0] << 0x17 |
                      (uint)(auVar171[0] & 1) << 0x18 | (uint)(auVar183[0] & 1) << 0x19 |
                      (uint)(auVar195[0] & 1) << 0x1a | (uint)(auVar207[0] & 1) << 0x1b |
                      (uint)(auVar219[0] & 1) << 0x1c | (uint)(auVar231[0] & 1) << 0x1d |
                      (uint)(auVar243[0] & 1) << 0x1e | (uint)(bVar256 >> 7) << 0x1f) +
             POPCOUNT((uint)(auVar5[0] & 1) | (uint)(auVar13[0] & 1) << 1 |
                      (uint)(auVar21[0] & 1) << 2 | (uint)(auVar29[0] & 1) << 3 |
                      (uint)(auVar37[0] & 1) << 4 | (uint)(auVar45[0] & 1) << 5 |
                      (uint)(auVar53[0] & 1) << 6 | (uint)(auVar69[0] & 1) << 7 |
                      (uint)(auVar93[0] & 1) << 8 | (uint)(auVar117[0] & 1) << 9 |
                      (uint)(auVar141[0] & 1) << 10 | (uint)(auVar165[0] & 1) << 0xb |
                      (uint)(auVar189[0] & 1) << 0xc | (uint)(auVar213[0] & 1) << 0xd |
                      (uint)(auVar237[0] & 1) << 0xe | (uint)auVar61[0] << 0xf |
                      (uint)(auVar73[0] & 1) << 0x10 | (uint)(auVar85[0] & 1) << 0x11 |
                      (uint)(auVar97[0] & 1) << 0x12 | (uint)(auVar109[0] & 1) << 0x13 |
                      (uint)(auVar121[0] & 1) << 0x14 | (uint)(auVar133[0] & 1) << 0x15 |
                      (uint)(auVar145[0] & 1) << 0x16 | (uint)auVar157[0] << 0x17 |
                      (uint)(auVar169[0] & 1) << 0x18 | (uint)(auVar181[0] & 1) << 0x19 |
                      (uint)(auVar193[0] & 1) << 0x1a | (uint)(auVar205[0] & 1) << 0x1b |
                      (uint)(auVar217[0] & 1) << 0x1c | (uint)(auVar229[0] & 1) << 0x1d |
                      (uint)(auVar241[0] & 1) << 0x1e | (uint)(bVar254 >> 7) << 0x1f) +
             POPCOUNT((uint)(auVar6[0] & 1) | (uint)(auVar14[0] & 1) << 1 |
                      (uint)(auVar22[0] & 1) << 2 | (uint)(auVar30[0] & 1) << 3 |
                      (uint)(auVar38[0] & 1) << 4 | (uint)(auVar46[0] & 1) << 5 |
                      (uint)(auVar54[0] & 1) << 6 | (uint)(auVar78[0] & 1) << 7 |
                      (uint)(auVar102[0] & 1) << 8 | (uint)(auVar126[0] & 1) << 9 |
                      (uint)(auVar150[0] & 1) << 10 | (uint)(auVar174[0] & 1) << 0xb |
                      (uint)(auVar198[0] & 1) << 0xc | (uint)(auVar222[0] & 1) << 0xd |
                      (uint)(auVar246[0] & 1) << 0xe | (uint)auVar62[0] << 0xf |
                      (uint)(auVar74[0] & 1) << 0x10 | (uint)(auVar86[0] & 1) << 0x11 |
                      (uint)(auVar98[0] & 1) << 0x12 | (uint)(auVar110[0] & 1) << 0x13 |
                      (uint)(auVar122[0] & 1) << 0x14 | (uint)(auVar134[0] & 1) << 0x15 |
                      (uint)(auVar146[0] & 1) << 0x16 | (uint)auVar158[0] << 0x17 |
                      (uint)(auVar170[0] & 1) << 0x18 | (uint)(auVar182[0] & 1) << 0x19 |
                      (uint)(auVar194[0] & 1) << 0x1a | (uint)(auVar206[0] & 1) << 0x1b |
                      (uint)(auVar218[0] & 1) << 0x1c | (uint)(auVar230[0] & 1) << 0x1d |
                      (uint)(auVar242[0] & 1) << 0x1e | (uint)(bVar255 >> 7) << 0x1f) +
             *(int *)((long)flags + lVar262 + 0x1c);
        lVar262 = lVar262 + -4;
      } while (lVar262 != 0);
      uVar260 = uVar261;
      uVar259 = uVar261 + 8;
    } while (uVar261 + 8 <= uVar250);
  }
  auVar272 = _DAT_001126c0;
  auVar271 = _DAT_001126a0;
  uVar260 = uVar261 | 4;
  auVar267 = _DAT_001126a0;
  auVar268 = _DAT_001126c0;
  while (uVar259 = uVar260, _DAT_001126a0 = auVar267, _DAT_001126c0 = auVar268, uVar259 <= uVar250)
  {
    lVar262 = 0x20;
    auVar267 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar261 * 0x10),auVar271,
                                 *(undefined1 (*) [32])(array + uVar261 * 0x10 + 0x10));
    auVar268 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar261 * 0x10 + 0x10),auVar272,
                                 *(undefined1 (*) [32])(array + uVar261 * 0x10));
    auVar269 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar261 * 0x10 + 0x20),auVar271,
                                 *(undefined1 (*) [32])(array + uVar261 * 0x10 + 0x30));
    auVar270 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar261 * 0x10 + 0x30),auVar272,
                                 *(undefined1 (*) [32])(array + uVar261 * 0x10 + 0x20));
    do {
      auVar263 = auVar267 >> 7;
      auVar2 = auVar267 >> 0xf;
      auVar6 = auVar267 >> 0x17;
      auVar10 = auVar267 >> 0x1f;
      auVar14 = auVar267 >> 0x27;
      auVar18 = auVar267 >> 0x2f;
      auVar22 = auVar267 >> 0x37;
      auVar26 = auVar267 >> 0x3f;
      auVar30 = auVar267 >> 0x47;
      auVar34 = auVar267 >> 0x4f;
      auVar38 = auVar267 >> 0x57;
      auVar42 = auVar267 >> 0x5f;
      auVar46 = auVar267 >> 0x67;
      auVar50 = auVar267 >> 0x6f;
      auVar54 = auVar267 >> 0x77;
      auVar66 = auVar267 >> 0x7f;
      auVar78 = auVar267 >> 0x87;
      auVar90 = auVar267 >> 0x8f;
      auVar102 = auVar267 >> 0x97;
      auVar114 = auVar267 >> 0x9f;
      auVar126 = auVar267 >> 0xa7;
      auVar138 = auVar267 >> 0xaf;
      auVar150 = auVar267 >> 0xb7;
      auVar162 = auVar267 >> 0xbf;
      auVar174 = auVar267 >> 199;
      auVar186 = auVar267 >> 0xcf;
      auVar198 = auVar267 >> 0xd7;
      auVar210 = auVar267 >> 0xdf;
      auVar222 = auVar267 >> 0xe7;
      auVar234 = auVar267 >> 0xef;
      auVar246 = auVar267 >> 0xf7;
      bVar251 = auVar267[0x1f];
      auVar264 = auVar268 >> 7;
      auVar3 = auVar268 >> 0xf;
      auVar7 = auVar268 >> 0x17;
      auVar11 = auVar268 >> 0x1f;
      auVar15 = auVar268 >> 0x27;
      auVar19 = auVar268 >> 0x2f;
      auVar23 = auVar268 >> 0x37;
      auVar27 = auVar268 >> 0x3f;
      auVar31 = auVar268 >> 0x47;
      auVar35 = auVar268 >> 0x4f;
      auVar39 = auVar268 >> 0x57;
      auVar43 = auVar268 >> 0x5f;
      auVar47 = auVar268 >> 0x67;
      auVar51 = auVar268 >> 0x6f;
      auVar55 = auVar268 >> 0x77;
      auVar67 = auVar268 >> 0x7f;
      auVar79 = auVar268 >> 0x87;
      auVar91 = auVar268 >> 0x8f;
      auVar103 = auVar268 >> 0x97;
      auVar115 = auVar268 >> 0x9f;
      auVar127 = auVar268 >> 0xa7;
      auVar139 = auVar268 >> 0xaf;
      auVar151 = auVar268 >> 0xb7;
      auVar163 = auVar268 >> 0xbf;
      auVar175 = auVar268 >> 199;
      auVar187 = auVar268 >> 0xcf;
      auVar199 = auVar268 >> 0xd7;
      auVar211 = auVar268 >> 0xdf;
      auVar223 = auVar268 >> 0xe7;
      auVar235 = auVar268 >> 0xef;
      auVar247 = auVar268 >> 0xf7;
      bVar252 = auVar268[0x1f];
      auVar265 = auVar269 >> 7;
      auVar4 = auVar269 >> 0xf;
      auVar8 = auVar269 >> 0x17;
      auVar12 = auVar269 >> 0x1f;
      auVar16 = auVar269 >> 0x27;
      auVar20 = auVar269 >> 0x2f;
      auVar24 = auVar269 >> 0x37;
      auVar28 = auVar269 >> 0x3f;
      auVar32 = auVar269 >> 0x47;
      auVar36 = auVar269 >> 0x4f;
      auVar40 = auVar269 >> 0x57;
      auVar44 = auVar269 >> 0x5f;
      auVar48 = auVar269 >> 0x67;
      auVar52 = auVar269 >> 0x6f;
      auVar56 = auVar269 >> 0x77;
      auVar68 = auVar269 >> 0x7f;
      auVar80 = auVar269 >> 0x87;
      auVar92 = auVar269 >> 0x8f;
      auVar104 = auVar269 >> 0x97;
      auVar116 = auVar269 >> 0x9f;
      auVar128 = auVar269 >> 0xa7;
      auVar140 = auVar269 >> 0xaf;
      auVar152 = auVar269 >> 0xb7;
      auVar164 = auVar269 >> 0xbf;
      auVar176 = auVar269 >> 199;
      auVar188 = auVar269 >> 0xcf;
      auVar200 = auVar269 >> 0xd7;
      auVar212 = auVar269 >> 0xdf;
      auVar224 = auVar269 >> 0xe7;
      auVar236 = auVar269 >> 0xef;
      auVar248 = auVar269 >> 0xf7;
      bVar253 = auVar269[0x1f];
      auVar267 = vpaddb_avx2(auVar267,auVar267);
      auVar268 = vpaddb_avx2(auVar268,auVar268);
      auVar269 = vpaddb_avx2(auVar269,auVar269);
      auVar266 = auVar270 >> 7;
      auVar5 = auVar270 >> 0xf;
      auVar9 = auVar270 >> 0x17;
      auVar13 = auVar270 >> 0x1f;
      auVar17 = auVar270 >> 0x27;
      auVar21 = auVar270 >> 0x2f;
      auVar25 = auVar270 >> 0x37;
      auVar29 = auVar270 >> 0x3f;
      auVar33 = auVar270 >> 0x47;
      auVar37 = auVar270 >> 0x4f;
      auVar41 = auVar270 >> 0x57;
      auVar45 = auVar270 >> 0x5f;
      auVar49 = auVar270 >> 0x67;
      auVar53 = auVar270 >> 0x6f;
      auVar57 = auVar270 >> 0x77;
      auVar69 = auVar270 >> 0x7f;
      auVar81 = auVar270 >> 0x87;
      auVar93 = auVar270 >> 0x8f;
      auVar105 = auVar270 >> 0x97;
      auVar117 = auVar270 >> 0x9f;
      auVar129 = auVar270 >> 0xa7;
      auVar141 = auVar270 >> 0xaf;
      auVar153 = auVar270 >> 0xb7;
      auVar165 = auVar270 >> 0xbf;
      auVar177 = auVar270 >> 199;
      auVar189 = auVar270 >> 0xcf;
      auVar201 = auVar270 >> 0xd7;
      auVar213 = auVar270 >> 0xdf;
      auVar225 = auVar270 >> 0xe7;
      auVar237 = auVar270 >> 0xef;
      auVar249 = auVar270 >> 0xf7;
      bVar254 = auVar270[0x1f];
      auVar270 = vpaddb_avx2(auVar270,auVar270);
      *(int *)((long)flags + lVar262 + -4) =
           POPCOUNT((uint)(auVar265[0] & 1) | (uint)(auVar4[0] & 1) << 1 |
                    (uint)(auVar8[0] & 1) << 2 | (uint)(auVar12[0] & 1) << 3 |
                    (uint)(auVar16[0] & 1) << 4 | (uint)(auVar20[0] & 1) << 5 |
                    (uint)(auVar24[0] & 1) << 6 | (uint)(auVar28[0] & 1) << 7 |
                    (uint)(auVar32[0] & 1) << 8 | (uint)(auVar36[0] & 1) << 9 |
                    (uint)(auVar40[0] & 1) << 10 | (uint)(auVar44[0] & 1) << 0xb |
                    (uint)(auVar48[0] & 1) << 0xc | (uint)(auVar52[0] & 1) << 0xd |
                    (uint)(auVar56[0] & 1) << 0xe | (uint)auVar68[0] << 0xf |
                    (uint)(auVar80[0] & 1) << 0x10 | (uint)(auVar92[0] & 1) << 0x11 |
                    (uint)(auVar104[0] & 1) << 0x12 | (uint)(auVar116[0] & 1) << 0x13 |
                    (uint)(auVar128[0] & 1) << 0x14 | (uint)(auVar140[0] & 1) << 0x15 |
                    (uint)(auVar152[0] & 1) << 0x16 | (uint)auVar164[0] << 0x17 |
                    (uint)(auVar176[0] & 1) << 0x18 | (uint)(auVar188[0] & 1) << 0x19 |
                    (uint)(auVar200[0] & 1) << 0x1a | (uint)(auVar212[0] & 1) << 0x1b |
                    (uint)(auVar224[0] & 1) << 0x1c | (uint)(auVar236[0] & 1) << 0x1d |
                    (uint)(auVar248[0] & 1) << 0x1e | (uint)(bVar253 >> 7) << 0x1f) +
           POPCOUNT((uint)(auVar263[0] & 1) | (uint)(auVar2[0] & 1) << 1 |
                    (uint)(auVar6[0] & 1) << 2 | (uint)(auVar10[0] & 1) << 3 |
                    (uint)(auVar14[0] & 1) << 4 | (uint)(auVar18[0] & 1) << 5 |
                    (uint)(auVar22[0] & 1) << 6 | (uint)(auVar26[0] & 1) << 7 |
                    (uint)(auVar30[0] & 1) << 8 | (uint)(auVar34[0] & 1) << 9 |
                    (uint)(auVar38[0] & 1) << 10 | (uint)(auVar42[0] & 1) << 0xb |
                    (uint)(auVar46[0] & 1) << 0xc | (uint)(auVar50[0] & 1) << 0xd |
                    (uint)(auVar54[0] & 1) << 0xe | (uint)auVar66[0] << 0xf |
                    (uint)(auVar78[0] & 1) << 0x10 | (uint)(auVar90[0] & 1) << 0x11 |
                    (uint)(auVar102[0] & 1) << 0x12 | (uint)(auVar114[0] & 1) << 0x13 |
                    (uint)(auVar126[0] & 1) << 0x14 | (uint)(auVar138[0] & 1) << 0x15 |
                    (uint)(auVar150[0] & 1) << 0x16 | (uint)auVar162[0] << 0x17 |
                    (uint)(auVar174[0] & 1) << 0x18 | (uint)(auVar186[0] & 1) << 0x19 |
                    (uint)(auVar198[0] & 1) << 0x1a | (uint)(auVar210[0] & 1) << 0x1b |
                    (uint)(auVar222[0] & 1) << 0x1c | (uint)(auVar234[0] & 1) << 0x1d |
                    (uint)(auVar246[0] & 1) << 0x1e | (uint)(bVar251 >> 7) << 0x1f) +
           *(int *)((long)flags + lVar262 + -4);
      *(int *)((long)flags + lVar262 + 0x1c) =
           POPCOUNT((uint)(auVar266[0] & 1) | (uint)(auVar5[0] & 1) << 1 |
                    (uint)(auVar9[0] & 1) << 2 | (uint)(auVar13[0] & 1) << 3 |
                    (uint)(auVar17[0] & 1) << 4 | (uint)(auVar21[0] & 1) << 5 |
                    (uint)(auVar25[0] & 1) << 6 | (uint)(auVar29[0] & 1) << 7 |
                    (uint)(auVar33[0] & 1) << 8 | (uint)(auVar37[0] & 1) << 9 |
                    (uint)(auVar41[0] & 1) << 10 | (uint)(auVar45[0] & 1) << 0xb |
                    (uint)(auVar49[0] & 1) << 0xc | (uint)(auVar53[0] & 1) << 0xd |
                    (uint)(auVar57[0] & 1) << 0xe | (uint)auVar69[0] << 0xf |
                    (uint)(auVar81[0] & 1) << 0x10 | (uint)(auVar93[0] & 1) << 0x11 |
                    (uint)(auVar105[0] & 1) << 0x12 | (uint)(auVar117[0] & 1) << 0x13 |
                    (uint)(auVar129[0] & 1) << 0x14 | (uint)(auVar141[0] & 1) << 0x15 |
                    (uint)(auVar153[0] & 1) << 0x16 | (uint)auVar165[0] << 0x17 |
                    (uint)(auVar177[0] & 1) << 0x18 | (uint)(auVar189[0] & 1) << 0x19 |
                    (uint)(auVar201[0] & 1) << 0x1a | (uint)(auVar213[0] & 1) << 0x1b |
                    (uint)(auVar225[0] & 1) << 0x1c | (uint)(auVar237[0] & 1) << 0x1d |
                    (uint)(auVar249[0] & 1) << 0x1e | (uint)(bVar254 >> 7) << 0x1f) +
           POPCOUNT((uint)(auVar264[0] & 1) | (uint)(auVar3[0] & 1) << 1 |
                    (uint)(auVar7[0] & 1) << 2 | (uint)(auVar11[0] & 1) << 3 |
                    (uint)(auVar15[0] & 1) << 4 | (uint)(auVar19[0] & 1) << 5 |
                    (uint)(auVar23[0] & 1) << 6 | (uint)(auVar27[0] & 1) << 7 |
                    (uint)(auVar31[0] & 1) << 8 | (uint)(auVar35[0] & 1) << 9 |
                    (uint)(auVar39[0] & 1) << 10 | (uint)(auVar43[0] & 1) << 0xb |
                    (uint)(auVar47[0] & 1) << 0xc | (uint)(auVar51[0] & 1) << 0xd |
                    (uint)(auVar55[0] & 1) << 0xe | (uint)auVar67[0] << 0xf |
                    (uint)(auVar79[0] & 1) << 0x10 | (uint)(auVar91[0] & 1) << 0x11 |
                    (uint)(auVar103[0] & 1) << 0x12 | (uint)(auVar115[0] & 1) << 0x13 |
                    (uint)(auVar127[0] & 1) << 0x14 | (uint)(auVar139[0] & 1) << 0x15 |
                    (uint)(auVar151[0] & 1) << 0x16 | (uint)auVar163[0] << 0x17 |
                    (uint)(auVar175[0] & 1) << 0x18 | (uint)(auVar187[0] & 1) << 0x19 |
                    (uint)(auVar199[0] & 1) << 0x1a | (uint)(auVar211[0] & 1) << 0x1b |
                    (uint)(auVar223[0] & 1) << 0x1c | (uint)(auVar235[0] & 1) << 0x1d |
                    (uint)(auVar247[0] & 1) << 0x1e | (uint)(bVar252 >> 7) << 0x1f) +
           *(int *)((long)flags + lVar262 + 0x1c);
      lVar262 = lVar262 + -4;
    } while (lVar262 != 0);
    uVar261 = uVar259;
    auVar267 = _DAT_001126a0;
    auVar268 = _DAT_001126c0;
    uVar260 = uVar259 + 4;
  }
  while (uVar260 = uVar261 + 2, uVar260 <= uVar250) {
    lVar262 = 0x20;
    auVar271 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar261 * 0x10),auVar267,
                                 *(undefined1 (*) [32])(array + uVar261 * 0x10 + 0x10));
    auVar272 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar261 * 0x10 + 0x10),auVar268,
                                 *(undefined1 (*) [32])(array + uVar261 * 0x10));
    do {
      auVar269 = auVar271 >> 7;
      auVar270 = auVar271 >> 0xf;
      auVar263 = auVar271 >> 0x17;
      auVar264 = auVar271 >> 0x1f;
      auVar265 = auVar271 >> 0x27;
      auVar266 = auVar271 >> 0x2f;
      auVar2 = auVar271 >> 0x37;
      auVar3 = auVar271 >> 0x3f;
      auVar4 = auVar271 >> 0x47;
      auVar5 = auVar271 >> 0x4f;
      auVar6 = auVar271 >> 0x57;
      auVar7 = auVar271 >> 0x5f;
      auVar8 = auVar271 >> 0x67;
      auVar9 = auVar271 >> 0x6f;
      auVar10 = auVar271 >> 0x77;
      auVar11 = auVar271 >> 0x7f;
      auVar12 = auVar271 >> 0x87;
      auVar13 = auVar271 >> 0x8f;
      auVar14 = auVar271 >> 0x97;
      auVar15 = auVar271 >> 0x9f;
      auVar16 = auVar271 >> 0xa7;
      auVar17 = auVar271 >> 0xaf;
      auVar18 = auVar271 >> 0xb7;
      auVar19 = auVar271 >> 0xbf;
      auVar20 = auVar271 >> 199;
      auVar21 = auVar271 >> 0xcf;
      auVar22 = auVar271 >> 0xd7;
      auVar23 = auVar271 >> 0xdf;
      auVar24 = auVar271 >> 0xe7;
      auVar25 = auVar271 >> 0xef;
      auVar26 = auVar271 >> 0xf7;
      bVar251 = auVar271[0x1f];
      auVar271 = vpaddb_avx2(auVar271,auVar271);
      piVar1 = (int *)((long)flags + lVar262 + -4);
      *piVar1 = *piVar1 + POPCOUNT((uint)(auVar269[0] & 1) | (uint)(auVar270[0] & 1) << 1 |
                                   (uint)(auVar263[0] & 1) << 2 | (uint)(auVar264[0] & 1) << 3 |
                                   (uint)(auVar265[0] & 1) << 4 | (uint)(auVar266[0] & 1) << 5 |
                                   (uint)(auVar2[0] & 1) << 6 | (uint)(auVar3[0] & 1) << 7 |
                                   (uint)(auVar4[0] & 1) << 8 | (uint)(auVar5[0] & 1) << 9 |
                                   (uint)(auVar6[0] & 1) << 10 | (uint)(auVar7[0] & 1) << 0xb |
                                   (uint)(auVar8[0] & 1) << 0xc | (uint)(auVar9[0] & 1) << 0xd |
                                   (uint)(auVar10[0] & 1) << 0xe | (uint)auVar11[0] << 0xf |
                                   (uint)(auVar12[0] & 1) << 0x10 | (uint)(auVar13[0] & 1) << 0x11 |
                                   (uint)(auVar14[0] & 1) << 0x12 | (uint)(auVar15[0] & 1) << 0x13 |
                                   (uint)(auVar16[0] & 1) << 0x14 | (uint)(auVar17[0] & 1) << 0x15 |
                                   (uint)(auVar18[0] & 1) << 0x16 | (uint)auVar19[0] << 0x17 |
                                   (uint)(auVar20[0] & 1) << 0x18 | (uint)(auVar21[0] & 1) << 0x19 |
                                   (uint)(auVar22[0] & 1) << 0x1a | (uint)(auVar23[0] & 1) << 0x1b |
                                   (uint)(auVar24[0] & 1) << 0x1c | (uint)(auVar25[0] & 1) << 0x1d |
                                   (uint)(auVar26[0] & 1) << 0x1e | (uint)(bVar251 >> 7) << 0x1f);
      auVar269 = auVar272 >> 7;
      auVar270 = auVar272 >> 0xf;
      auVar263 = auVar272 >> 0x17;
      auVar264 = auVar272 >> 0x1f;
      auVar265 = auVar272 >> 0x27;
      auVar266 = auVar272 >> 0x2f;
      auVar2 = auVar272 >> 0x37;
      auVar3 = auVar272 >> 0x3f;
      auVar4 = auVar272 >> 0x47;
      auVar5 = auVar272 >> 0x4f;
      auVar6 = auVar272 >> 0x57;
      auVar7 = auVar272 >> 0x5f;
      auVar8 = auVar272 >> 0x67;
      auVar9 = auVar272 >> 0x6f;
      auVar10 = auVar272 >> 0x77;
      auVar11 = auVar272 >> 0x7f;
      auVar12 = auVar272 >> 0x87;
      auVar13 = auVar272 >> 0x8f;
      auVar14 = auVar272 >> 0x97;
      auVar15 = auVar272 >> 0x9f;
      auVar16 = auVar272 >> 0xa7;
      auVar17 = auVar272 >> 0xaf;
      auVar18 = auVar272 >> 0xb7;
      auVar19 = auVar272 >> 0xbf;
      auVar20 = auVar272 >> 199;
      auVar21 = auVar272 >> 0xcf;
      auVar22 = auVar272 >> 0xd7;
      auVar23 = auVar272 >> 0xdf;
      auVar24 = auVar272 >> 0xe7;
      auVar25 = auVar272 >> 0xef;
      auVar26 = auVar272 >> 0xf7;
      bVar251 = auVar272[0x1f];
      auVar272 = vpaddb_avx2(auVar272,auVar272);
      piVar1 = (int *)((long)flags + lVar262 + 0x1c);
      *piVar1 = *piVar1 + POPCOUNT((uint)(auVar269[0] & 1) | (uint)(auVar270[0] & 1) << 1 |
                                   (uint)(auVar263[0] & 1) << 2 | (uint)(auVar264[0] & 1) << 3 |
                                   (uint)(auVar265[0] & 1) << 4 | (uint)(auVar266[0] & 1) << 5 |
                                   (uint)(auVar2[0] & 1) << 6 | (uint)(auVar3[0] & 1) << 7 |
                                   (uint)(auVar4[0] & 1) << 8 | (uint)(auVar5[0] & 1) << 9 |
                                   (uint)(auVar6[0] & 1) << 10 | (uint)(auVar7[0] & 1) << 0xb |
                                   (uint)(auVar8[0] & 1) << 0xc | (uint)(auVar9[0] & 1) << 0xd |
                                   (uint)(auVar10[0] & 1) << 0xe | (uint)auVar11[0] << 0xf |
                                   (uint)(auVar12[0] & 1) << 0x10 | (uint)(auVar13[0] & 1) << 0x11 |
                                   (uint)(auVar14[0] & 1) << 0x12 | (uint)(auVar15[0] & 1) << 0x13 |
                                   (uint)(auVar16[0] & 1) << 0x14 | (uint)(auVar17[0] & 1) << 0x15 |
                                   (uint)(auVar18[0] & 1) << 0x16 | (uint)auVar19[0] << 0x17 |
                                   (uint)(auVar20[0] & 1) << 0x18 | (uint)(auVar21[0] & 1) << 0x19 |
                                   (uint)(auVar22[0] & 1) << 0x1a | (uint)(auVar23[0] & 1) << 0x1b |
                                   (uint)(auVar24[0] & 1) << 0x1c | (uint)(auVar25[0] & 1) << 0x1d |
                                   (uint)(auVar26[0] & 1) << 0x1e | (uint)(bVar251 >> 7) << 0x1f);
      lVar262 = lVar262 + -4;
      uVar261 = uVar260;
    } while (lVar262 != 0);
  }
  uVar261 = uVar261 << 4;
  if (uVar261 < len) {
    auVar273 = vmovdqu64_avx512f(*(undefined1 (*) [64])flags);
    auVar274 = vpmovsxbd_avx512f(_DAT_00111080);
    auVar275 = vpbroadcastd_avx512f(ZEXT416(1));
    do {
      uVar261 = uVar261 + 1;
      auVar276 = vpbroadcastd_avx512f();
      auVar276 = vpsrlvd_avx512f(auVar276,auVar274);
      auVar276 = vpandd_avx512f(auVar276,auVar275);
      auVar273 = vpaddd_avx512f(auVar276,auVar273);
    } while (len != uVar261);
    auVar273 = vmovdqu64_avx512f(auVar273);
    *(undefined1 (*) [64])flags = auVar273;
  }
  return 0;
}

Assistant:

int pospopcnt_u16_avx2_blend_popcnt_unroll8(const uint16_t* array, uint32_t len, uint32_t* flags) {
    const __m256i* data_vectors = (const __m256i*)(array);
    const uint32_t n_cycles = len / 16;

    size_t i = 0;
    for (/**/; i + 8 <= n_cycles; i += 8) {
#define L(p) __m256i v##p = _mm256_loadu_si256(data_vectors+i+p);
        L(0) L(1) L(2) L(3)
        L(4) L(5) L(6) L(7) 
        
#define U0(p,k) __m256i input##p = _mm256_or_si256(_mm256_and_si256(v##p, _mm256_set1_epi16(0x00FF)), _mm256_slli_epi16(v##k, 8));
#define U1(p,k) __m256i input##k = _mm256_or_si256(_mm256_and_si256(v##p, _mm256_set1_epi16(0xFF00)), _mm256_srli_epi16(v##k, 8));
#define U(p, k)  U0(p,k) U1(p,k)
       U(0,1) U(2, 3) U(4, 5) U(6, 7)
        
        for (int i = 0; i < 8; ++i) {
#define A0(p) flags[ 7 - i] += _mm_popcnt_u32(_mm256_movemask_epi8(input##p));
#define A1(k) flags[15 - i] += _mm_popcnt_u32(_mm256_movemask_epi8(input##k));
#define A(p, k) A0(p) A1(k)
            A(0,1) A(2, 3) A(4, 5) A(6, 7)

#define P0(p) input##p = _mm256_add_epi8(input##p, input##p);
#define P(p, k) input##p = P0(p) P0(k)
            P(0,1) P(2, 3) P(4, 5) P(6, 7)
        }
    }

    for (/**/; i + 4 <= n_cycles; i += 4) {
        L(0) L(1) L(2) L(3)
        U(0,1) U(2, 3)
        
        for (int i = 0; i < 8; ++i) {
            A(0,1) A( 2, 3)
            P(0,1) P( 2, 3)
        }
    }

    for (/**/; i + 2 <= n_cycles; i += 2) {
        L(0) L(1)
        U(0,1)
        
        for (int i = 0; i < 8; ++i) {
            A(0,1)
            P(0,1)
        }
    }

    i *= 16;
    for (/**/; i < len; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += ((array[i] & (1 << j)) >> j);
        }
    }

#undef L
#undef U0
#undef U1
#undef U
#undef A0
#undef A1
#undef A
#undef P0
#undef P

    return 0;
}